

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O3

REF_STATUS
ref_mpi_blindsend(REF_MPI ref_mpi,REF_INT *proc,void *send,REF_INT ldim,REF_INT nsend,void **recv,
                 REF_INT *nrecv,REF_TYPE type)

{
  uint uVar1;
  REF_INT *send_size;
  REF_INT *recv_size;
  long lVar2;
  undefined4 *__ptr;
  void *pvVar3;
  void *recv_00;
  int iVar4;
  ulong uVar5;
  undefined8 uVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  
  *recv = (void *)0x0;
  lVar8 = (long)ref_mpi->n;
  if (lVar8 < 2) {
    *nrecv = nsend;
    if (type == 3) {
      if (nsend * ldim < 0) {
        pcVar9 = "malloc *((REF_DBL **)recv) of REF_DBL negative";
        uVar6 = 0x445;
        goto LAB_001f8e1b;
      }
      sVar7 = (ulong)(uint)(nsend * ldim) << 3;
      pvVar3 = malloc(sVar7);
      *recv = pvVar3;
      if (pvVar3 != (void *)0x0) {
LAB_001f8d12:
        if (nsend * ldim == 0) {
          return 0;
        }
        memcpy(pvVar3,send,sVar7);
        return 0;
      }
      pcVar9 = "malloc *((REF_DBL **)recv) of REF_DBL NULL";
      uVar6 = 0x445;
      goto LAB_001f907e;
    }
    if (type == 2) {
      if (nsend * ldim < 0) {
        pcVar9 = "malloc *((REF_LONG **)recv) of REF_LONG negative";
        uVar6 = 0x43f;
        goto LAB_001f8e1b;
      }
      sVar7 = (ulong)(uint)(nsend * ldim) << 3;
      pvVar3 = malloc(sVar7);
      *recv = pvVar3;
      if (pvVar3 != (void *)0x0) goto LAB_001f8d12;
      pcVar9 = "malloc *((REF_LONG **)recv) of REF_LONG NULL";
      uVar6 = 0x43f;
      goto LAB_001f907e;
    }
    if (type == 1) {
      if (nsend * ldim < 0) {
        pcVar9 = "malloc *((REF_INT **)recv) of REF_INT negative";
        uVar6 = 0x439;
        goto LAB_001f8e1b;
      }
      sVar7 = (ulong)(uint)(nsend * ldim) << 2;
      pvVar3 = malloc(sVar7);
      *recv = pvVar3;
      if (pvVar3 != (void *)0x0) goto LAB_001f8d12;
      pcVar9 = "malloc *((REF_INT **)recv) of REF_INT NULL";
      uVar6 = 0x439;
      goto LAB_001f907e;
    }
    uVar6 = 1099;
LAB_001f8d56:
    pcVar9 = "data type";
    uVar1 = 6;
    uVar5 = 6;
  }
  else {
    sVar7 = lVar8 * 4;
    send_size = (REF_INT *)calloc(1,sVar7);
    if (send_size == (REF_INT *)0x0) {
      pcVar9 = "malloc a_size of REF_INT NULL";
      uVar6 = 0x450;
LAB_001f907e:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar6,
             "ref_mpi_blindsend",pcVar9);
      return 2;
    }
    recv_size = (REF_INT *)calloc(1,sVar7);
    if (recv_size == (REF_INT *)0x0) {
      pcVar9 = "malloc b_size of REF_INT NULL";
      uVar6 = 0x451;
      goto LAB_001f907e;
    }
    if (0 < nsend) {
      uVar5 = 0;
      do {
        send_size[proc[uVar5]] = send_size[proc[uVar5]] + 1;
        uVar5 = uVar5 + 1;
      } while ((uint)nsend != uVar5);
    }
    *recv_size = *send_size;
    lVar2 = 0;
    iVar10 = 0;
    do {
      iVar10 = iVar10 + send_size[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar8 != lVar2);
    lVar2 = 0;
    iVar12 = 0;
    do {
      iVar12 = iVar12 + recv_size[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar8 != lVar2);
    __ptr = (undefined4 *)malloc(sVar7);
    if (__ptr == (undefined4 *)0x0) {
      pcVar9 = "malloc a_next of REF_INT NULL";
      uVar6 = 0x45e;
      goto LAB_001f907e;
    }
    *__ptr = 0;
    lVar2 = 1;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + send_size[lVar2 + -1];
      __ptr[lVar2] = iVar4;
      lVar2 = lVar2 + 1;
    } while (lVar8 != lVar2);
    *recv = (void *)0x0;
    if (type == 3) {
      if (iVar10 * ldim < 0) {
        pcVar9 = "malloc a_data of REF_DBL negative";
        uVar6 = 0x47b;
LAB_001f8e1b:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar6
               ,"ref_mpi_blindsend",pcVar9);
        return 1;
      }
      pvVar3 = malloc((ulong)(uint)(iVar10 * ldim) << 3);
      if (pvVar3 == (void *)0x0) {
        pcVar9 = "malloc a_data of REF_DBL NULL";
        uVar6 = 0x47b;
        goto LAB_001f907e;
      }
      if (iVar12 * ldim < 0) {
        pcVar9 = "malloc *((REF_DBL **)recv) of REF_DBL negative";
        uVar6 = 0x47c;
        goto LAB_001f8e1b;
      }
      recv_00 = malloc((ulong)(uint)(iVar12 * ldim) << 3);
      *recv = recv_00;
      if (recv_00 == (void *)0x0) {
        pcVar9 = "malloc *((REF_DBL **)recv) of REF_DBL NULL";
        uVar6 = 0x47c;
        goto LAB_001f907e;
      }
      if (0 < nsend) {
        uVar5 = 0;
        uVar11 = 0;
        do {
          if (ldim < 1) {
            lVar8 = (long)proc[uVar11];
            iVar10 = __ptr[lVar8];
          }
          else {
            lVar8 = (long)proc[uVar11];
            iVar10 = __ptr[lVar8];
            memcpy((void *)((long)pvVar3 + (long)(iVar10 * ldim) * 8),
                   (void *)((long)send + uVar5 * 8),(ulong)(uint)ldim << 3);
          }
          __ptr[lVar8] = iVar10 + 1;
          uVar11 = uVar11 + 1;
          uVar5 = (ulong)(uint)((int)uVar5 + ldim);
        } while ((uint)nsend != uVar11);
      }
    }
    else if (type == 2) {
      if (iVar10 * ldim < 0) {
        pcVar9 = "malloc a_data of REF_LONG negative";
        uVar6 = 0x471;
        goto LAB_001f8e1b;
      }
      pvVar3 = malloc((ulong)(uint)(iVar10 * ldim) << 3);
      if (pvVar3 == (void *)0x0) {
        pcVar9 = "malloc a_data of REF_LONG NULL";
        uVar6 = 0x471;
        goto LAB_001f907e;
      }
      if (iVar12 * ldim < 0) {
        pcVar9 = "malloc *((REF_LONG **)recv) of REF_LONG negative";
        uVar6 = 0x472;
        goto LAB_001f8e1b;
      }
      recv_00 = malloc((ulong)(uint)(iVar12 * ldim) << 3);
      *recv = recv_00;
      if (recv_00 == (void *)0x0) {
        pcVar9 = "malloc *((REF_LONG **)recv) of REF_LONG NULL";
        uVar6 = 0x472;
        goto LAB_001f907e;
      }
      if (0 < nsend) {
        uVar5 = 0;
        uVar11 = 0;
        do {
          if (ldim < 1) {
            lVar8 = (long)proc[uVar11];
            iVar10 = __ptr[lVar8];
          }
          else {
            lVar8 = (long)proc[uVar11];
            iVar10 = __ptr[lVar8];
            memcpy((void *)((long)pvVar3 + (long)(iVar10 * ldim) * 8),
                   (void *)((long)send + uVar5 * 8),(ulong)(uint)ldim << 3);
          }
          __ptr[lVar8] = iVar10 + 1;
          uVar11 = uVar11 + 1;
          uVar5 = (ulong)(uint)((int)uVar5 + ldim);
        } while ((uint)nsend != uVar11);
      }
    }
    else {
      if (type != 1) {
        uVar6 = 0x485;
        goto LAB_001f8d56;
      }
      if (iVar10 * ldim < 0) {
        pcVar9 = "malloc a_data of REF_INT negative";
        uVar6 = 0x467;
        goto LAB_001f8e1b;
      }
      pvVar3 = malloc((ulong)(uint)(iVar10 * ldim) << 2);
      if (pvVar3 == (void *)0x0) {
        pcVar9 = "malloc a_data of REF_INT NULL";
        uVar6 = 0x467;
        goto LAB_001f907e;
      }
      if (iVar12 * ldim < 0) {
        pcVar9 = "malloc *((REF_INT **)recv) of REF_INT negative";
        uVar6 = 0x468;
        goto LAB_001f8e1b;
      }
      recv_00 = malloc((ulong)(uint)(iVar12 * ldim) << 2);
      *recv = recv_00;
      if (recv_00 == (void *)0x0) {
        pcVar9 = "malloc *((REF_INT **)recv) of REF_INT NULL";
        uVar6 = 0x468;
        goto LAB_001f907e;
      }
      if (0 < nsend) {
        uVar5 = 0;
        uVar11 = 0;
        do {
          if (ldim < 1) {
            lVar8 = (long)proc[uVar11];
            iVar10 = __ptr[lVar8];
          }
          else {
            lVar8 = (long)proc[uVar11];
            iVar10 = __ptr[lVar8];
            memcpy((void *)((long)pvVar3 + (long)(iVar10 * ldim) * 4),
                   (void *)((long)send + uVar5 * 4),(ulong)(uint)ldim << 2);
          }
          __ptr[lVar8] = iVar10 + 1;
          uVar11 = uVar11 + 1;
          uVar5 = (ulong)(uint)((int)uVar5 + ldim);
        } while ((uint)nsend != uVar11);
      }
    }
    uVar1 = ref_mpi_alltoallv(ref_mpi,pvVar3,send_size,recv_00,recv_size,ldim,type);
    if (uVar1 == 0) {
      *nrecv = iVar12;
      free(__ptr);
      free(pvVar3);
      free(recv_size);
      free(send_size);
      return 0;
    }
    pcVar9 = "alltoallv global";
    uVar6 = 0x489;
    uVar5 = (ulong)uVar1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar6,
         "ref_mpi_blindsend",uVar5,pcVar9);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_blindsend(REF_MPI ref_mpi, REF_INT *proc, void *send,
                                     REF_INT ldim, REF_INT nsend, void **recv,
                                     REF_INT *nrecv, REF_TYPE type) {
  REF_INT i, l, part;
  REF_INT *a_size, *b_size;
  REF_INT *a_next;
  REF_INT a_total, b_total;

  void *a_data;

  a_data = NULL;
  *recv = NULL;

  if (!ref_mpi_para(ref_mpi)) {
    *nrecv = nsend;
    switch (type) {
      case REF_INT_TYPE:
        ref_malloc(*((REF_INT **)recv), ldim * nsend, REF_INT);
        for (i = 0; i < ldim * nsend; i++) {
          (*((REF_INT **)recv))[i] = ((REF_INT *)send)[i];
        }
        break;
      case REF_LONG_TYPE:
        ref_malloc(*((REF_LONG **)recv), ldim * nsend, REF_LONG);
        for (i = 0; i < ldim * nsend; i++) {
          (*((REF_LONG **)recv))[i] = ((REF_LONG *)send)[i];
        }
        break;
      case REF_DBL_TYPE:
        ref_malloc(*((REF_DBL **)recv), ldim * nsend, REF_DBL);
        for (i = 0; i < ldim * nsend; i++) {
          (*((REF_DBL **)recv))[i] = ((REF_DBL *)send)[i];
        }
        break;
      default:
        RSS(REF_IMPLEMENT, "data type");
    }
    return REF_SUCCESS;
  }

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  for (i = 0; i < nsend; i++) a_size[proc[i]]++;

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  a_data = NULL;
  *recv = NULL;
  switch (type) {
    case REF_INT_TYPE:
      ref_malloc(a_data, ldim * a_total, REF_INT);
      ref_malloc(*((REF_INT **)recv), ldim * b_total, REF_INT);
      for (i = 0; i < nsend; i++) {
        for (l = 0; l < ldim; l++)
          ((REF_INT *)a_data)[l + ldim * a_next[proc[i]]] =
              ((REF_INT *)send)[l + ldim * i];
        a_next[proc[i]]++;
      }
      break;
    case REF_LONG_TYPE:
      ref_malloc(a_data, ldim * a_total, REF_LONG);
      ref_malloc(*((REF_LONG **)recv), ldim * b_total, REF_LONG);
      for (i = 0; i < nsend; i++) {
        for (l = 0; l < ldim; l++)
          ((REF_LONG *)a_data)[l + ldim * a_next[proc[i]]] =
              ((REF_LONG *)send)[l + ldim * i];
        a_next[proc[i]]++;
      }
      break;
    case REF_DBL_TYPE:
      ref_malloc(a_data, ldim * a_total, REF_DBL);
      ref_malloc(*((REF_DBL **)recv), ldim * b_total, REF_DBL);
      for (i = 0; i < nsend; i++) {
        for (l = 0; l < ldim; l++)
          ((REF_DBL *)a_data)[l + ldim * a_next[proc[i]]] =
              ((REF_DBL *)send)[l + ldim * i];
        a_next[proc[i]]++;
      }
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_data, a_size, *recv, b_size, ldim, type),
      "alltoallv global");

  *nrecv = b_total;

  ref_free(a_next);
  ref_free(a_data);
  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}